

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# microui.c
# Opt level: O1

int mu_textbox_raw(mu_Context *ctx,char *buf,int bufsz,mu_Id id,mu_Rect r,int opt)

{
  mu_Color color;
  mu_Font font;
  int iVar1;
  size_t sVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  mu_Vec2 pos;
  int iVar6;
  mu_Rect rect;
  int local_38;
  
  mu_update_control(ctx,id,r,opt | 0x100);
  uVar3 = 0;
  if (ctx->focus == id) {
    sVar2 = strlen(buf);
    uVar5 = (uint)sVar2;
    sVar2 = strlen(ctx->input_text);
    uVar3 = ~uVar5 + bufsz;
    if ((int)(uint)sVar2 <= (int)(~uVar5 + bufsz)) {
      uVar3 = (uint)sVar2;
    }
    if ((int)uVar3 < 1) {
      uVar3 = 0;
    }
    else {
      memcpy(buf + (int)uVar5,ctx->input_text,(ulong)uVar3);
      uVar5 = uVar5 + uVar3;
      buf[(int)uVar5] = '\0';
      uVar3 = 4;
    }
    if ((0 < (int)uVar5) && ((ctx->key_pressed & 8U) != 0)) {
      buf[(ulong)uVar5 - 1] = '\0';
      uVar3 = 4;
    }
    if ((ctx->key_pressed & 0x10) != 0) {
      ctx->focus = 0;
      ctx->updated_focus = 1;
      uVar3 = uVar3 | 2;
    }
  }
  if ((opt & 8U) == 0) {
    iVar4 = 0xb;
    if (ctx->focus != id) {
      iVar4 = (ctx->hover == id) + 9;
    }
    (*ctx->draw_frame)(ctx,r,iVar4);
  }
  if (ctx->focus == id) {
    color = ctx->style->colors[0];
    font = ctx->style->font;
    iVar1 = (*ctx->text_width)(font,buf,-1,ctx->user_data);
    uVar5 = (*ctx->text_height)(font);
    iVar4 = ctx->style->padding;
    iVar6 = ~(iVar4 + iVar1) + r.w;
    if (iVar4 <= iVar6) {
      iVar6 = iVar4;
    }
    iVar6 = iVar6 + r.x;
    local_38 = r.y;
    local_38 = (int)(r.h - uVar5) / 2 + local_38;
    mu_push_clip_rect(ctx,r);
    pos.y = local_38;
    pos.x = iVar6;
    mu_draw_text(ctx,font,buf,-1,pos,color);
    rect.y = local_38;
    rect.x = iVar6 + iVar1;
    rect._8_8_ = ((ulong)uVar5 << 0x20) + 1;
    mu_draw_rect(ctx,rect,color);
    mu_pop_clip_rect(ctx);
  }
  else {
    mu_draw_control_text(ctx,buf,r,0,opt);
  }
  return uVar3;
}

Assistant:

int mu_textbox_raw(mu_Context *ctx, char *buf, int bufsz, mu_Id id, mu_Rect r,
  int opt)
{
  int res = 0;
  mu_update_control(ctx, id, r, opt | MU_OPT_HOLDFOCUS);

  if (ctx->focus == id) {
    /* handle text input */
    int len = strlen(buf);
    int n = mu_min(bufsz - len - 1, (int) strlen(ctx->input_text));
    if (n > 0) {
      memcpy(buf + len, ctx->input_text, n);
      len += n;
      buf[len] = '\0';
      res |= MU_RES_CHANGE;
    }
    /* handle backspace */
    if (ctx->key_pressed & MU_KEY_BACKSPACE && len > 0) {
      /* skip utf-8 continuation bytes */
      while ((buf[--len] & 0xc0) == 0x80 && len > 0);
      buf[len] = '\0';
      res |= MU_RES_CHANGE;
    }
    /* handle return */
    if (ctx->key_pressed & MU_KEY_RETURN) {
      mu_set_focus(ctx, 0);
      res |= MU_RES_SUBMIT;
    }
  }

  /* draw */
  mu_draw_control_frame(ctx, id, r, MU_COLOR_BASE, opt);
  if (ctx->focus == id) {
    mu_Color color = ctx->style->colors[MU_COLOR_TEXT];
    mu_Font font = ctx->style->font;
    int textw = ctx->text_width(font, buf, -1, ctx->user_data);
    int texth = ctx->text_height(font);
    int ofx = r.w - ctx->style->padding - textw - 1;
    int textx = r.x + mu_min(ofx, ctx->style->padding);
    int texty = r.y + (r.h - texth) / 2;
    mu_push_clip_rect(ctx, r);
    mu_draw_text(ctx, font, buf, -1, mu_vec2(textx, texty), color);
    mu_draw_rect(ctx, mu_rect(textx + textw, texty, 1, texth), color);
    mu_pop_clip_rect(ctx);
  } else {
    mu_draw_control_text(ctx, buf, r, MU_COLOR_TEXT, opt);
  }

  return res;
}